

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLoadCommandCommand.cxx
# Opt level: O0

bool __thiscall
cmLoadedCommand::InitialPass
          (cmLoadedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type sVar1;
  char *pcVar2;
  allocator<char> local_61;
  string local_60;
  int local_40;
  int local_3c;
  int result;
  int i;
  char **argv;
  cmExecutionStatus *pcStack_28;
  int argc;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmLoadedCommand *this_local;
  
  if ((this->info).InitialPass == (CM_INITIAL_PASS_FUNCTION)0x0) {
    this_local._7_1_ = true;
  }
  else {
    pcStack_28 = param_2;
    param_2_local = (cmExecutionStatus *)args;
    args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this;
    if ((this->info).Error != (char *)0x0) {
      free((this->info).Error);
    }
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local);
    argv._4_4_ = (int)sVar1;
    _result = (char **)0x0;
    if (argv._4_4_ != 0) {
      _result = (char **)malloc((long)argv._4_4_ << 3);
    }
    for (local_3c = 0; local_3c < argv._4_4_; local_3c = local_3c + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)param_2_local,(long)local_3c);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      pcVar2 = strdup(pcVar2);
      _result[local_3c] = pcVar2;
    }
    InstallSignalHandlers((this->info).Name,0);
    local_40 = (*(this->info).InitialPass)
                         (&this->info,(this->super_cmCommand).Makefile,argv._4_4_,_result);
    InstallSignalHandlers((this->info).Name,1);
    cmFreeArguments(argv._4_4_,_result);
    if (local_40 == 0) {
      if ((this->info).Error != (char *)0x0) {
        pcVar2 = (this->info).Error;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar2,&local_61);
        cmCommand::SetError(&this->super_cmCommand,&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        std::allocator<char>::~allocator(&local_61);
      }
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmLoadedCommand::InitialPass(std::vector<std::string> const& args,
                                  cmExecutionStatus&)
{
  if (!info.InitialPass) {
    return true;
  }

  // clear the error string
  if (this->info.Error) {
    free(this->info.Error);
  }

  // create argc and argv and then invoke the command
  int argc = static_cast<int>(args.size());
  char** argv = nullptr;
  if (argc) {
    argv = static_cast<char**>(malloc(argc * sizeof(char*)));
  }
  int i;
  for (i = 0; i < argc; ++i) {
    argv[i] = strdup(args[i].c_str());
  }
  cmLoadedCommand::InstallSignalHandlers(info.Name);
  int result = info.InitialPass(&info, this->Makefile, argc, argv);
  cmLoadedCommand::InstallSignalHandlers(info.Name, 1);
  cmFreeArguments(argc, argv);

  if (result) {
    return true;
  }

  /* Initial Pass must have failed so set the error string */
  if (this->info.Error) {
    this->SetError(this->info.Error);
  }
  return false;
}